

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O2

void sysbvm_byteStream_nextPut(sysbvm_context_t *context,sysbvm_tuple_t byteStream,uint8_t value)

{
  ulong requiredCapacity;
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  long lVar4;
  
  if ((byteStream & 0xf) == 0 && byteStream != 0) {
    uVar1 = *(ulong *)(byteStream + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar4 = (long)uVar1 >> 4;
    }
    else {
      lVar4 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(byteStream + 0x18);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar3 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar3 = 0;
    }
    requiredCapacity = lVar4 + 1;
    if (uVar3 < requiredCapacity) {
      sysbvm_byteStream_increaseCapacityToAtLeast(context,byteStream,requiredCapacity);
      uVar1 = *(ulong *)(byteStream + 0x18);
    }
    *(uint8_t *)(uVar1 + 0x10 + lVar4) = value;
    sVar2 = sysbvm_tuple_size_encode(context,requiredCapacity);
    *(sysbvm_tuple_t *)(byteStream + 0x10) = sVar2;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_byteStream_nextPut(sysbvm_context_t *context, sysbvm_tuple_t byteStream, uint8_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream))
        return;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t requiredCapacity = size + 1;
    if(requiredCapacity > capacity)
        sysbvm_byteStream_increaseCapacityToAtLeast(context, byteStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    storage->bytes[size] = value;
    byteStreamObject->size = sysbvm_tuple_size_encode(context, size + 1);

}